

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_message.hpp
# Opt level: O3

iuStreamMessage * __thiscall
iutest::detail::iuStreamMessage::operator<<(iuStreamMessage *this,__int128 *value)

{
  undefined1 v [16];
  long *in_stack_fffffffffffffe48;
  long in_stack_fffffffffffffe50;
  long local_1a8 [2];
  undefined1 local_198 [392];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_198);
  v._8_8_ = in_stack_fffffffffffffe50;
  v._0_8_ = in_stack_fffffffffffffe48;
  PrintTo(*(detail **)value,(Int)v,*(iu_ostream **)((long)value + 8));
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(this->m_stream).super_iu_stringstream.field_0x10,
             (char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe50);
  if (in_stack_fffffffffffffe48 != local_1a8) {
    operator_delete(in_stack_fffffffffffffe48,local_1a8[0] + 1);
  }
  return this;
}

Assistant:

iuStreamMessage& operator << (const T& value)
    {
#if !defined(IUTEST_NO_ARGUMENT_DEPENDENT_LOOKUP)
        m_stream << PrintToString(value);
#else
        m_stream << value;
#endif
        return *this;
    }